

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_crypto.cpp
# Opt level: O2

uint32_t __thiscall
duckdb::DecryptionTransport::read_virt(DecryptionTransport *this,uint8_t *buf,uint32_t len)

{
  ulong uVar1;
  InvalidInputException *this_00;
  uint32_t uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  allocator local_41;
  string local_40;
  
  uVar1 = (ulong)this->read_buffer_size;
  uVar3 = (ulong)this->read_buffer_offset;
  uVar5 = len;
  if (((this->transport_remaining + uVar1) - uVar3) - 0x10 < (ulong)len) {
    this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_40,"Too many bytes requested from crypto buffer",&local_41);
    InvalidInputException::InvalidInputException(this_00,&local_40);
    __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  for (; uVar2 = (uint32_t)uVar3, uVar5 != 0; uVar5 = uVar5 - uVar4) {
    if (uVar2 == (uint32_t)uVar1) {
      ReadBlock(this,buf);
      uVar1 = (ulong)this->read_buffer_size;
      uVar2 = this->read_buffer_offset;
    }
    uVar4 = (int)uVar1 - uVar2;
    if (uVar5 <= uVar4) {
      uVar4 = uVar5;
    }
    uVar3 = (ulong)(uVar2 + uVar4);
    this->read_buffer_offset = uVar2 + uVar4;
    buf = buf + uVar4;
  }
  return len;
}

Assistant:

uint32_t read_virt(uint8_t *buf, uint32_t len) override {
		const uint32_t result = len;

		if (len > transport_remaining - ParquetCrypto::TAG_BYTES + read_buffer_size - read_buffer_offset) {
			throw InvalidInputException("Too many bytes requested from crypto buffer");
		}

		while (len != 0) {
			if (read_buffer_offset == read_buffer_size) {
				ReadBlock(buf);
			}
			const auto next = MinValue(read_buffer_size - read_buffer_offset, len);
			read_buffer_offset += next;
			buf += next;
			len -= next;
		}

		return result;
	}